

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ClassSpecifierSyntax * __thiscall slang::parsing::Parser::parseClassSpecifier(Parser *this)

{
  LanguageVersion LVar1;
  bool bVar2;
  SourceLocation location;
  ClassSpecifierSyntax *this_00;
  Diagnostic *this_01;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  Token colon;
  Token TVar6;
  SourceRange range;
  string_view arg;
  Token local_38;
  Token local_28;
  
  bVar2 = ParserBase::peek(&this->super_ParserBase,Colon);
  if (bVar2) {
    colon = ParserBase::consume(&this->super_ParserBase);
    Token::Token(&local_38);
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    uVar3 = TVar6.kind - 0xa6;
    if ((uVar3 < 0x1b) && ((0x4000005U >> (uVar3 & 0x1f) & 1) != 0)) {
      local_38 = ParserBase::consume(&this->super_ParserBase);
    }
    else if (TVar6.kind == Identifier) {
      ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x100320005);
    }
    else {
      local_28 = ParserBase::peek(&this->super_ParserBase);
      location = Token::location(&local_28);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x320005,location);
    }
    this_00 = slang::syntax::SyntaxFactory::classSpecifier(&this->factory,colon,local_38);
    if (((int)(this->parseOptions).languageVersion < 1) && (local_38.info != (Info *)0x0)) {
      range = slang::syntax::SyntaxNode::sourceRange(&this_00->super_SyntaxNode);
      this_01 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x20001,range);
      LVar1 = (this->parseOptions).languageVersion;
      sVar5 = 9;
      if (LVar1 == Default) {
        pcVar4 = "1800-2017";
      }
      else if (LVar1 == v1800_2023) {
        pcVar4 = "1800-2023";
      }
      else {
        pcVar4 = "";
        sVar5 = 0;
      }
      arg._M_str = pcVar4;
      arg._M_len = sVar5;
      Diagnostic::operator<<(this_01,arg);
    }
  }
  else {
    this_00 = (ClassSpecifierSyntax *)0x0;
  }
  return this_00;
}

Assistant:

ClassSpecifierSyntax* Parser::parseClassSpecifier() {
    if (peek(TokenKind::Colon)) {
        auto colon = consume();

        Token keyword;
        switch (peek().kind) {
            case TokenKind::InitialKeyword:
            case TokenKind::ExtendsKeyword:
            case TokenKind::FinalKeyword:
                keyword = consume();
                break;
            case TokenKind::Identifier:
                skipToken(diag::ExpectedClassSpecifier);
                break;
            default:
                addDiag(diag::ExpectedClassSpecifier, peek().location());
                break;
        }

        auto& result = factory.classSpecifier(colon, keyword);
        if (parseOptions.languageVersion < LanguageVersion::v1800_2023 && keyword) {
            addDiag(diag::WrongLanguageVersion, result.sourceRange())
                << toString(parseOptions.languageVersion);
        }

        return &result;
    }
    return nullptr;
}